

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

string_view __thiscall absl::lts_20240722::Status::message(Status *this)

{
  ulong rep;
  Nonnull<const_status_internal::StatusRep_*> pSVar1;
  string_view sVar2;
  string_view sVar3;
  
  rep = this->rep_;
  if ((rep & 1) == 0) {
    pSVar1 = RepToPointer(rep);
    sVar2._M_str = (pSVar1->message_)._M_dataplus._M_p;
    sVar2._M_len = (pSVar1->message_)._M_string_length;
    return sVar2;
  }
  sVar3._M_len = (ulong)((uint)((long)(rep << 0x3e) >> 0x3f) & 0x1b);
  sVar3._M_str = (char *)((long)(rep << 0x3e) >> 0x3f & (ulong)"Status accessed after move.");
  return sVar3;
}

Assistant:

inline absl::string_view Status::message() const {
  return !IsInlined(rep_)
             ? RepToPointer(rep_)->message()
             : (IsMovedFrom(rep_) ? absl::string_view(kMovedFromString)
                                  : absl::string_view());
}